

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

size_t bitset_count(bitset_t *bitset)

{
  ulong uVar1;
  uint64_t *puVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  ushort uVar8;
  byte bVar24;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  char cVar25;
  byte bVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  byte bVar30;
  char cVar31;
  byte bVar32;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  char cVar33;
  byte bVar56;
  char cVar57;
  byte bVar58;
  char cVar59;
  byte bVar60;
  char cVar61;
  byte bVar62;
  char cVar63;
  byte bVar64;
  undefined1 auVar38 [12];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar40 [12];
  undefined1 auVar52 [16];
  undefined1 auVar41 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  char cVar65;
  byte bVar80;
  char cVar81;
  byte bVar82;
  char cVar83;
  byte bVar84;
  char cVar85;
  byte bVar86;
  char cVar87;
  byte bVar88;
  undefined1 auVar70 [12];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  char cVar89;
  byte bVar102;
  char cVar103;
  byte bVar104;
  char cVar105;
  byte bVar106;
  char cVar107;
  byte bVar108;
  char cVar109;
  byte bVar110;
  undefined1 auVar94 [12];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  ushort uVar34;
  undefined4 uVar35;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined1 auVar39 [12];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  ushort uVar66;
  undefined4 uVar67;
  undefined6 uVar68;
  undefined8 uVar69;
  undefined1 auVar71 [12];
  undefined1 auVar72 [14];
  undefined1 auVar73 [14];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  ushort uVar90;
  undefined4 uVar91;
  undefined6 uVar92;
  undefined8 uVar93;
  undefined1 auVar95 [12];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  
  uVar1 = bitset->arraysize;
  if (uVar1 < 8) {
    sVar3 = 0;
    uVar5 = 0;
  }
  else {
    puVar2 = bitset->array;
    sVar3 = 0;
    uVar6 = 0;
    do {
      auVar78 = *(undefined1 (*) [16])(puVar2 + uVar6);
      auVar20 = *(undefined1 (*) [16])(puVar2 + uVar6 + 2);
      auVar112 = *(undefined1 (*) [16])(puVar2 + uVar6 + 4);
      auVar47 = *(undefined1 (*) [16])(puVar2 + uVar6 + 6);
      auVar111._0_2_ = auVar112._0_2_ >> 1;
      auVar111._2_2_ = auVar112._2_2_ >> 1;
      auVar111._4_2_ = auVar112._4_2_ >> 1;
      auVar111._6_2_ = auVar112._6_2_ >> 1;
      auVar111._8_2_ = auVar112._8_2_ >> 1;
      auVar111._10_2_ = auVar112._10_2_ >> 1;
      auVar111._12_2_ = auVar112._12_2_ >> 1;
      auVar111._14_2_ = auVar112._14_2_ >> 1;
      auVar111 = auVar111 & _DAT_00103080;
      uVar8 = CONCAT11(auVar112[1] - auVar111[1],auVar112[0] - auVar111[0]);
      uVar9 = CONCAT13(auVar112[3] - auVar111[3],CONCAT12(auVar112[2] - auVar111[2],uVar8));
      uVar10 = CONCAT15(auVar112[5] - auVar111[5],CONCAT14(auVar112[4] - auVar111[4],uVar9));
      uVar11 = CONCAT17(auVar112[7] - auVar111[7],CONCAT16(auVar112[6] - auVar111[6],uVar10));
      auVar70._0_10_ =
           CONCAT19(auVar112[9] - auVar111[9],CONCAT18(auVar112[8] - auVar111[8],uVar11));
      auVar70[10] = auVar112[10] - auVar111[10];
      auVar70[0xb] = auVar112[0xb] - auVar111[0xb];
      auVar72[0xc] = auVar112[0xc] - auVar111[0xc];
      auVar72._0_12_ = auVar70;
      auVar72[0xd] = auVar112[0xd] - auVar111[0xd];
      auVar74[0xe] = auVar112[0xe] - auVar111[0xe];
      auVar74._0_14_ = auVar72;
      auVar74[0xf] = auVar112[0xf] - auVar111[0xf];
      auVar112 = auVar74 & _DAT_00103090;
      auVar75._0_2_ = uVar8 >> 2;
      auVar75._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar75._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar75._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar75._8_2_ = (ushort)((unkuint10)auVar70._0_10_ >> 0x42);
      auVar75._10_2_ = auVar70._10_2_ >> 2;
      auVar75._12_2_ = auVar72._12_2_ >> 2;
      auVar75._14_2_ = auVar74._14_2_ >> 2;
      auVar75 = auVar75 & _DAT_00103090;
      cVar65 = auVar75[0] + auVar112[0];
      bVar80 = auVar75[1] + auVar112[1];
      uVar66 = CONCAT11(bVar80,cVar65);
      cVar81 = auVar75[2] + auVar112[2];
      bVar82 = auVar75[3] + auVar112[3];
      uVar67 = CONCAT13(bVar82,CONCAT12(cVar81,uVar66));
      cVar83 = auVar75[4] + auVar112[4];
      bVar84 = auVar75[5] + auVar112[5];
      uVar68 = CONCAT15(bVar84,CONCAT14(cVar83,uVar67));
      cVar85 = auVar75[6] + auVar112[6];
      bVar86 = auVar75[7] + auVar112[7];
      uVar69 = CONCAT17(bVar86,CONCAT16(cVar85,uVar68));
      cVar87 = auVar75[8] + auVar112[8];
      bVar88 = auVar75[9] + auVar112[9];
      auVar71._0_10_ = CONCAT19(bVar88,CONCAT18(cVar87,uVar69));
      auVar71[10] = auVar75[10] + auVar112[10];
      auVar71[0xb] = auVar75[0xb] + auVar112[0xb];
      auVar73[0xc] = auVar75[0xc] + auVar112[0xc];
      auVar73._0_12_ = auVar71;
      auVar73[0xd] = auVar75[0xd] + auVar112[0xd];
      auVar76[0xe] = auVar75[0xe] + auVar112[0xe];
      auVar76._0_14_ = auVar73;
      auVar76[0xf] = auVar75[0xf] + auVar112[0xf];
      auVar77._0_2_ = auVar78._0_2_ >> 1;
      auVar77._2_2_ = auVar78._2_2_ >> 1;
      auVar77._4_2_ = auVar78._4_2_ >> 1;
      auVar77._6_2_ = auVar78._6_2_ >> 1;
      auVar77._8_2_ = auVar78._8_2_ >> 1;
      auVar77._10_2_ = auVar78._10_2_ >> 1;
      auVar77._12_2_ = auVar78._12_2_ >> 1;
      auVar77._14_2_ = auVar78._14_2_ >> 1;
      auVar77 = auVar77 & _DAT_00103080;
      uVar8 = CONCAT11(auVar78[1] - auVar77[1],auVar78[0] - auVar77[0]);
      uVar9 = CONCAT13(auVar78[3] - auVar77[3],CONCAT12(auVar78[2] - auVar77[2],uVar8));
      uVar10 = CONCAT15(auVar78[5] - auVar77[5],CONCAT14(auVar78[4] - auVar77[4],uVar9));
      uVar11 = CONCAT17(auVar78[7] - auVar77[7],CONCAT16(auVar78[6] - auVar77[6],uVar10));
      auVar94._0_10_ = CONCAT19(auVar78[9] - auVar77[9],CONCAT18(auVar78[8] - auVar77[8],uVar11));
      auVar94[10] = auVar78[10] - auVar77[10];
      auVar94[0xb] = auVar78[0xb] - auVar77[0xb];
      auVar96[0xc] = auVar78[0xc] - auVar77[0xc];
      auVar96._0_12_ = auVar94;
      auVar96[0xd] = auVar78[0xd] - auVar77[0xd];
      auVar98[0xe] = auVar78[0xe] - auVar77[0xe];
      auVar98._0_14_ = auVar96;
      auVar98[0xf] = auVar78[0xf] - auVar77[0xf];
      auVar78 = auVar98 & _DAT_00103090;
      auVar99._0_2_ = uVar8 >> 2;
      auVar99._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar99._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar99._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar99._8_2_ = (ushort)((unkuint10)auVar94._0_10_ >> 0x42);
      auVar99._10_2_ = auVar94._10_2_ >> 2;
      auVar99._12_2_ = auVar96._12_2_ >> 2;
      auVar99._14_2_ = auVar98._14_2_ >> 2;
      auVar99 = auVar99 & _DAT_00103090;
      cVar89 = auVar99[0] + auVar78[0];
      bVar102 = auVar99[1] + auVar78[1];
      uVar90 = CONCAT11(bVar102,cVar89);
      cVar103 = auVar99[2] + auVar78[2];
      bVar104 = auVar99[3] + auVar78[3];
      uVar91 = CONCAT13(bVar104,CONCAT12(cVar103,uVar90));
      cVar105 = auVar99[4] + auVar78[4];
      bVar106 = auVar99[5] + auVar78[5];
      uVar92 = CONCAT15(bVar106,CONCAT14(cVar105,uVar91));
      cVar107 = auVar99[6] + auVar78[6];
      bVar108 = auVar99[7] + auVar78[7];
      uVar93 = CONCAT17(bVar108,CONCAT16(cVar107,uVar92));
      cVar109 = auVar99[8] + auVar78[8];
      bVar110 = auVar99[9] + auVar78[9];
      auVar95._0_10_ = CONCAT19(bVar110,CONCAT18(cVar109,uVar93));
      auVar95[10] = auVar99[10] + auVar78[10];
      auVar95[0xb] = auVar99[0xb] + auVar78[0xb];
      auVar97[0xc] = auVar99[0xc] + auVar78[0xc];
      auVar97._0_12_ = auVar95;
      auVar97[0xd] = auVar99[0xd] + auVar78[0xd];
      auVar100[0xe] = auVar99[0xe] + auVar78[0xe];
      auVar100._0_14_ = auVar97;
      auVar100[0xf] = auVar99[0xf] + auVar78[0xf];
      auVar101._0_2_ = auVar47._0_2_ >> 1;
      auVar101._2_2_ = auVar47._2_2_ >> 1;
      auVar101._4_2_ = auVar47._4_2_ >> 1;
      auVar101._6_2_ = auVar47._6_2_ >> 1;
      auVar101._8_2_ = auVar47._8_2_ >> 1;
      auVar101._10_2_ = auVar47._10_2_ >> 1;
      auVar101._12_2_ = auVar47._12_2_ >> 1;
      auVar101._14_2_ = auVar47._14_2_ >> 1;
      auVar101 = auVar101 & _DAT_00103080;
      uVar8 = CONCAT11(auVar47[1] - auVar101[1],auVar47[0] - auVar101[0]);
      uVar9 = CONCAT13(auVar47[3] - auVar101[3],CONCAT12(auVar47[2] - auVar101[2],uVar8));
      uVar10 = CONCAT15(auVar47[5] - auVar101[5],CONCAT14(auVar47[4] - auVar101[4],uVar9));
      uVar11 = CONCAT17(auVar47[7] - auVar101[7],CONCAT16(auVar47[6] - auVar101[6],uVar10));
      auVar38._0_10_ = CONCAT19(auVar47[9] - auVar101[9],CONCAT18(auVar47[8] - auVar101[8],uVar11));
      auVar38[10] = auVar47[10] - auVar101[10];
      auVar38[0xb] = auVar47[0xb] - auVar101[0xb];
      auVar42[0xc] = auVar47[0xc] - auVar101[0xc];
      auVar42._0_12_ = auVar38;
      auVar42[0xd] = auVar47[0xd] - auVar101[0xd];
      auVar46[0xe] = auVar47[0xe] - auVar101[0xe];
      auVar46._0_14_ = auVar42;
      auVar46[0xf] = auVar47[0xf] - auVar101[0xf];
      auVar78 = auVar46 & _DAT_00103090;
      auVar47._0_2_ = uVar8 >> 2;
      auVar47._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar47._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar47._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar47._8_2_ = (ushort)((unkuint10)auVar38._0_10_ >> 0x42);
      auVar47._10_2_ = auVar38._10_2_ >> 2;
      auVar47._12_2_ = auVar42._12_2_ >> 2;
      auVar47._14_2_ = auVar46._14_2_ >> 2;
      auVar47 = auVar47 & _DAT_00103090;
      cVar33 = auVar47[0] + auVar78[0];
      bVar56 = auVar47[1] + auVar78[1];
      uVar34 = CONCAT11(bVar56,cVar33);
      cVar57 = auVar47[2] + auVar78[2];
      bVar58 = auVar47[3] + auVar78[3];
      uVar35 = CONCAT13(bVar58,CONCAT12(cVar57,uVar34));
      cVar59 = auVar47[4] + auVar78[4];
      bVar60 = auVar47[5] + auVar78[5];
      uVar36 = CONCAT15(bVar60,CONCAT14(cVar59,uVar35));
      cVar61 = auVar47[6] + auVar78[6];
      bVar62 = auVar47[7] + auVar78[7];
      uVar37 = CONCAT17(bVar62,CONCAT16(cVar61,uVar36));
      cVar63 = auVar47[8] + auVar78[8];
      bVar64 = auVar47[9] + auVar78[9];
      auVar39._0_10_ = CONCAT19(bVar64,CONCAT18(cVar63,uVar37));
      auVar39[10] = auVar47[10] + auVar78[10];
      auVar39[0xb] = auVar47[0xb] + auVar78[0xb];
      auVar43[0xc] = auVar47[0xc] + auVar78[0xc];
      auVar43._0_12_ = auVar39;
      auVar43[0xd] = auVar47[0xd] + auVar78[0xd];
      auVar48[0xe] = auVar47[0xe] + auVar78[0xe];
      auVar48._0_14_ = auVar43;
      auVar48[0xf] = auVar47[0xf] + auVar78[0xf];
      auVar49._0_2_ = auVar20._0_2_ >> 1;
      auVar49._2_2_ = auVar20._2_2_ >> 1;
      auVar49._4_2_ = auVar20._4_2_ >> 1;
      auVar49._6_2_ = auVar20._6_2_ >> 1;
      auVar49._8_2_ = auVar20._8_2_ >> 1;
      auVar49._10_2_ = auVar20._10_2_ >> 1;
      auVar49._12_2_ = auVar20._12_2_ >> 1;
      auVar49._14_2_ = auVar20._14_2_ >> 1;
      auVar49 = auVar49 & _DAT_00103080;
      uVar8 = CONCAT11(auVar20[1] - auVar49[1],auVar20[0] - auVar49[0]);
      uVar9 = CONCAT13(auVar20[3] - auVar49[3],CONCAT12(auVar20[2] - auVar49[2],uVar8));
      uVar10 = CONCAT15(auVar20[5] - auVar49[5],CONCAT14(auVar20[4] - auVar49[4],uVar9));
      uVar11 = CONCAT17(auVar20[7] - auVar49[7],CONCAT16(auVar20[6] - auVar49[6],uVar10));
      auVar12._0_10_ = CONCAT19(auVar20[9] - auVar49[9],CONCAT18(auVar20[8] - auVar49[8],uVar11));
      auVar12[10] = auVar20[10] - auVar49[10];
      auVar12[0xb] = auVar20[0xb] - auVar49[0xb];
      auVar16[0xc] = auVar20[0xc] - auVar49[0xc];
      auVar16._0_12_ = auVar12;
      auVar16[0xd] = auVar20[0xd] - auVar49[0xd];
      auVar78[0xe] = auVar20[0xe] - auVar49[0xe];
      auVar78._0_14_ = auVar16;
      auVar78[0xf] = auVar20[0xf] - auVar49[0xf];
      auVar47 = auVar78 & _DAT_00103090;
      auVar20._0_2_ = uVar8 >> 2;
      auVar20._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar20._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar20._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar20._8_2_ = (ushort)((unkuint10)auVar12._0_10_ >> 0x42);
      auVar20._10_2_ = auVar12._10_2_ >> 2;
      auVar20._12_2_ = auVar16._12_2_ >> 2;
      auVar20._14_2_ = auVar78._14_2_ >> 2;
      auVar20 = auVar20 & _DAT_00103090;
      cVar7 = auVar20[0] + auVar47[0];
      bVar24 = auVar20[1] + auVar47[1];
      uVar8 = CONCAT11(bVar24,cVar7);
      cVar25 = auVar20[2] + auVar47[2];
      bVar26 = auVar20[3] + auVar47[3];
      uVar9 = CONCAT13(bVar26,CONCAT12(cVar25,uVar8));
      cVar27 = auVar20[4] + auVar47[4];
      bVar28 = auVar20[5] + auVar47[5];
      uVar10 = CONCAT15(bVar28,CONCAT14(cVar27,uVar9));
      cVar29 = auVar20[6] + auVar47[6];
      bVar30 = auVar20[7] + auVar47[7];
      uVar11 = CONCAT17(bVar30,CONCAT16(cVar29,uVar10));
      cVar31 = auVar20[8] + auVar47[8];
      bVar32 = auVar20[9] + auVar47[9];
      auVar13._0_10_ = CONCAT19(bVar32,CONCAT18(cVar31,uVar11));
      auVar13[10] = auVar20[10] + auVar47[10];
      auVar13[0xb] = auVar20[0xb] + auVar47[0xb];
      auVar17[0xc] = auVar20[0xc] + auVar47[0xc];
      auVar17._0_12_ = auVar13;
      auVar17[0xd] = auVar20[0xd] + auVar47[0xd];
      auVar112[0xe] = auVar20[0xe] + auVar47[0xe];
      auVar112._0_14_ = auVar17;
      auVar112[0xf] = auVar20[0xf] + auVar47[0xf];
      auVar50[0] = ((char)(uVar8 >> 4) + cVar7 & 0xfU) + ((char)(uVar34 >> 4) + cVar33 & 0xfU) +
                   ((char)(uVar90 >> 4) + cVar89 & 0xfU) + ((char)(uVar66 >> 4) + cVar65 & 0xfU);
      auVar50[1] = ((bVar24 >> 4) + bVar24 & 0xf) + ((bVar56 >> 4) + bVar56 & 0xf) +
                   ((bVar102 >> 4) + bVar102 & 0xf) + ((bVar80 >> 4) + bVar80 & 0xf);
      auVar50[2] = ((char)(ushort)((uint)uVar9 >> 0x14) + cVar25 & 0xfU) +
                   ((char)(ushort)((uint)uVar35 >> 0x14) + cVar57 & 0xfU) +
                   ((char)(ushort)((uint)uVar91 >> 0x14) + cVar103 & 0xfU) +
                   ((char)(ushort)((uint)uVar67 >> 0x14) + cVar81 & 0xfU);
      auVar50[3] = ((bVar26 >> 4) + bVar26 & 0xf) + ((bVar58 >> 4) + bVar58 & 0xf) +
                   ((bVar104 >> 4) + bVar104 & 0xf) + ((bVar82 >> 4) + bVar82 & 0xf);
      auVar50[4] = ((char)(ushort)((uint6)uVar10 >> 0x24) + cVar27 & 0xfU) +
                   ((char)(ushort)((uint6)uVar36 >> 0x24) + cVar59 & 0xfU) +
                   ((char)(ushort)((uint6)uVar92 >> 0x24) + cVar105 & 0xfU) +
                   ((char)(ushort)((uint6)uVar68 >> 0x24) + cVar83 & 0xfU);
      auVar50[5] = ((bVar28 >> 4) + bVar28 & 0xf) + ((bVar60 >> 4) + bVar60 & 0xf) +
                   ((bVar106 >> 4) + bVar106 & 0xf) + ((bVar84 >> 4) + bVar84 & 0xf);
      auVar50[6] = ((char)(ushort)((ulong)uVar11 >> 0x34) + cVar29 & 0xfU) +
                   ((char)(ushort)((ulong)uVar37 >> 0x34) + cVar61 & 0xfU) +
                   ((char)(ushort)((ulong)uVar93 >> 0x34) + cVar107 & 0xfU) +
                   ((char)(ushort)((ulong)uVar69 >> 0x34) + cVar85 & 0xfU);
      auVar50[7] = ((bVar30 >> 4) + bVar30 & 0xf) + ((bVar62 >> 4) + bVar62 & 0xf) +
                   ((bVar108 >> 4) + bVar108 & 0xf) + ((bVar86 >> 4) + bVar86 & 0xf);
      auVar50[8] = ((char)(ushort)((unkuint10)auVar13._0_10_ >> 0x44) + cVar31 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar39._0_10_ >> 0x44) + cVar63 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar95._0_10_ >> 0x44) + cVar109 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar71._0_10_ >> 0x44) + cVar87 & 0xfU);
      auVar50[9] = ((bVar32 >> 4) + bVar32 & 0xf) + ((bVar64 >> 4) + bVar64 & 0xf) +
                   ((bVar110 >> 4) + bVar110 & 0xf) + ((bVar88 >> 4) + bVar88 & 0xf);
      auVar50[10] = ((char)(auVar13._10_2_ >> 4) + auVar13[10] & 0xfU) +
                    ((char)(auVar39._10_2_ >> 4) + auVar39[10] & 0xfU) +
                    ((char)(auVar95._10_2_ >> 4) + auVar95[10] & 0xfU) +
                    ((char)(auVar71._10_2_ >> 4) + auVar71[10] & 0xfU);
      auVar50[0xb] = ((auVar13[0xb] >> 4) + auVar13[0xb] & 0xf) +
                     ((auVar39[0xb] >> 4) + auVar39[0xb] & 0xf) +
                     ((auVar95[0xb] >> 4) + auVar95[0xb] & 0xf) +
                     ((auVar71[0xb] >> 4) + auVar71[0xb] & 0xf);
      auVar50[0xc] = ((char)(auVar17._12_2_ >> 4) + auVar17[0xc] & 0xfU) +
                     ((char)(auVar43._12_2_ >> 4) + auVar43[0xc] & 0xfU) +
                     ((char)(auVar97._12_2_ >> 4) + auVar97[0xc] & 0xfU) +
                     ((char)(auVar73._12_2_ >> 4) + auVar73[0xc] & 0xfU);
      auVar50[0xd] = ((auVar17[0xd] >> 4) + auVar17[0xd] & 0xf) +
                     ((auVar43[0xd] >> 4) + auVar43[0xd] & 0xf) +
                     ((auVar97[0xd] >> 4) + auVar97[0xd] & 0xf) +
                     ((auVar73[0xd] >> 4) + auVar73[0xd] & 0xf);
      auVar50[0xe] = ((char)(auVar112._14_2_ >> 4) + auVar112[0xe] & 0xfU) +
                     ((char)(auVar48._14_2_ >> 4) + auVar48[0xe] & 0xfU) +
                     ((char)(auVar100._14_2_ >> 4) + auVar100[0xe] & 0xfU) +
                     ((char)(auVar76._14_2_ >> 4) + auVar76[0xe] & 0xfU);
      auVar50[0xf] = ((auVar112[0xf] >> 4) + auVar112[0xf] & 0xf) +
                     ((auVar48[0xf] >> 4) + auVar48[0xf] & 0xf) +
                     ((auVar100[0xf] >> 4) + auVar100[0xf] & 0xf) +
                     ((auVar76[0xf] >> 4) + auVar76[0xf] & 0xf);
      auVar78 = psadbw(auVar50,(undefined1  [16])0x0);
      sVar3 = sVar3 + auVar78._8_8_ + auVar78._0_8_;
      uVar5 = uVar6 + 8;
      uVar4 = uVar6 + 0xf;
      uVar6 = uVar5;
    } while (uVar4 < uVar1);
  }
  if ((uVar5 | 3) < uVar1) {
    uVar6 = uVar5;
    do {
      auVar78 = *(undefined1 (*) [16])(bitset->array + uVar6);
      auVar20 = *(undefined1 (*) [16])(bitset->array + uVar6 + 2);
      auVar79._0_2_ = auVar20._0_2_ >> 1;
      auVar79._2_2_ = auVar20._2_2_ >> 1;
      auVar79._4_2_ = auVar20._4_2_ >> 1;
      auVar79._6_2_ = auVar20._6_2_ >> 1;
      auVar79._8_2_ = auVar20._8_2_ >> 1;
      auVar79._10_2_ = auVar20._10_2_ >> 1;
      auVar79._12_2_ = auVar20._12_2_ >> 1;
      auVar79._14_2_ = auVar20._14_2_ >> 1;
      auVar79 = auVar79 & _DAT_00103080;
      uVar8 = CONCAT11(auVar20[1] - auVar79[1],auVar20[0] - auVar79[0]);
      uVar9 = CONCAT13(auVar20[3] - auVar79[3],CONCAT12(auVar20[2] - auVar79[2],uVar8));
      uVar10 = CONCAT15(auVar20[5] - auVar79[5],CONCAT14(auVar20[4] - auVar79[4],uVar9));
      uVar11 = CONCAT17(auVar20[7] - auVar79[7],CONCAT16(auVar20[6] - auVar79[6],uVar10));
      auVar40._0_10_ = CONCAT19(auVar20[9] - auVar79[9],CONCAT18(auVar20[8] - auVar79[8],uVar11));
      auVar40[10] = auVar20[10] - auVar79[10];
      auVar40[0xb] = auVar20[0xb] - auVar79[0xb];
      auVar44[0xc] = auVar20[0xc] - auVar79[0xc];
      auVar44._0_12_ = auVar40;
      auVar44[0xd] = auVar20[0xd] - auVar79[0xd];
      auVar51[0xe] = auVar20[0xe] - auVar79[0xe];
      auVar51._0_14_ = auVar44;
      auVar51[0xf] = auVar20[0xf] - auVar79[0xf];
      auVar20 = auVar51 & _DAT_00103090;
      auVar52._0_2_ = uVar8 >> 2;
      auVar52._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar52._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar52._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar52._8_2_ = (ushort)((unkuint10)auVar40._0_10_ >> 0x42);
      auVar52._10_2_ = auVar40._10_2_ >> 2;
      auVar52._12_2_ = auVar44._12_2_ >> 2;
      auVar52._14_2_ = auVar51._14_2_ >> 2;
      auVar52 = auVar52 & _DAT_00103090;
      cVar33 = auVar52[0] + auVar20[0];
      bVar56 = auVar52[1] + auVar20[1];
      uVar34 = CONCAT11(bVar56,cVar33);
      cVar57 = auVar52[2] + auVar20[2];
      bVar58 = auVar52[3] + auVar20[3];
      uVar35 = CONCAT13(bVar58,CONCAT12(cVar57,uVar34));
      cVar59 = auVar52[4] + auVar20[4];
      bVar60 = auVar52[5] + auVar20[5];
      uVar36 = CONCAT15(bVar60,CONCAT14(cVar59,uVar35));
      cVar61 = auVar52[6] + auVar20[6];
      bVar62 = auVar52[7] + auVar20[7];
      uVar37 = CONCAT17(bVar62,CONCAT16(cVar61,uVar36));
      cVar63 = auVar52[8] + auVar20[8];
      bVar64 = auVar52[9] + auVar20[9];
      auVar41._0_10_ = CONCAT19(bVar64,CONCAT18(cVar63,uVar37));
      auVar41[10] = auVar52[10] + auVar20[10];
      auVar41[0xb] = auVar52[0xb] + auVar20[0xb];
      auVar45[0xc] = auVar52[0xc] + auVar20[0xc];
      auVar45._0_12_ = auVar41;
      auVar45[0xd] = auVar52[0xd] + auVar20[0xd];
      auVar53[0xe] = auVar52[0xe] + auVar20[0xe];
      auVar53._0_14_ = auVar45;
      auVar53[0xf] = auVar52[0xf] + auVar20[0xf];
      auVar54._0_2_ = auVar78._0_2_ >> 1;
      auVar54._2_2_ = auVar78._2_2_ >> 1;
      auVar54._4_2_ = auVar78._4_2_ >> 1;
      auVar54._6_2_ = auVar78._6_2_ >> 1;
      auVar54._8_2_ = auVar78._8_2_ >> 1;
      auVar54._10_2_ = auVar78._10_2_ >> 1;
      auVar54._12_2_ = auVar78._12_2_ >> 1;
      auVar54._14_2_ = auVar78._14_2_ >> 1;
      auVar54 = auVar54 & _DAT_00103080;
      uVar8 = CONCAT11(auVar78[1] - auVar54[1],auVar78[0] - auVar54[0]);
      uVar9 = CONCAT13(auVar78[3] - auVar54[3],CONCAT12(auVar78[2] - auVar54[2],uVar8));
      uVar10 = CONCAT15(auVar78[5] - auVar54[5],CONCAT14(auVar78[4] - auVar54[4],uVar9));
      uVar11 = CONCAT17(auVar78[7] - auVar54[7],CONCAT16(auVar78[6] - auVar54[6],uVar10));
      auVar14._0_10_ = CONCAT19(auVar78[9] - auVar54[9],CONCAT18(auVar78[8] - auVar54[8],uVar11));
      auVar14[10] = auVar78[10] - auVar54[10];
      auVar14[0xb] = auVar78[0xb] - auVar54[0xb];
      auVar18[0xc] = auVar78[0xc] - auVar54[0xc];
      auVar18._0_12_ = auVar14;
      auVar18[0xd] = auVar78[0xd] - auVar54[0xd];
      auVar21[0xe] = auVar78[0xe] - auVar54[0xe];
      auVar21._0_14_ = auVar18;
      auVar21[0xf] = auVar78[0xf] - auVar54[0xf];
      auVar78 = auVar21 & _DAT_00103090;
      auVar22._0_2_ = uVar8 >> 2;
      auVar22._2_2_ = (ushort)((uint)uVar9 >> 0x12);
      auVar22._4_2_ = (ushort)((uint6)uVar10 >> 0x22);
      auVar22._6_2_ = (ushort)((ulong)uVar11 >> 0x32);
      auVar22._8_2_ = (ushort)((unkuint10)auVar14._0_10_ >> 0x42);
      auVar22._10_2_ = auVar14._10_2_ >> 2;
      auVar22._12_2_ = auVar18._12_2_ >> 2;
      auVar22._14_2_ = auVar21._14_2_ >> 2;
      auVar22 = auVar22 & _DAT_00103090;
      cVar7 = auVar22[0] + auVar78[0];
      bVar24 = auVar22[1] + auVar78[1];
      uVar8 = CONCAT11(bVar24,cVar7);
      cVar25 = auVar22[2] + auVar78[2];
      bVar26 = auVar22[3] + auVar78[3];
      uVar9 = CONCAT13(bVar26,CONCAT12(cVar25,uVar8));
      cVar27 = auVar22[4] + auVar78[4];
      bVar28 = auVar22[5] + auVar78[5];
      uVar10 = CONCAT15(bVar28,CONCAT14(cVar27,uVar9));
      cVar29 = auVar22[6] + auVar78[6];
      bVar30 = auVar22[7] + auVar78[7];
      uVar11 = CONCAT17(bVar30,CONCAT16(cVar29,uVar10));
      cVar31 = auVar22[8] + auVar78[8];
      bVar32 = auVar22[9] + auVar78[9];
      auVar15._0_10_ = CONCAT19(bVar32,CONCAT18(cVar31,uVar11));
      auVar15[10] = auVar22[10] + auVar78[10];
      auVar15[0xb] = auVar22[0xb] + auVar78[0xb];
      auVar19[0xc] = auVar22[0xc] + auVar78[0xc];
      auVar19._0_12_ = auVar15;
      auVar19[0xd] = auVar22[0xd] + auVar78[0xd];
      auVar23[0xe] = auVar22[0xe] + auVar78[0xe];
      auVar23._0_14_ = auVar19;
      auVar23[0xf] = auVar22[0xf] + auVar78[0xf];
      auVar55[0] = ((char)(uVar8 >> 4) + cVar7 & 0xfU) + ((char)(uVar34 >> 4) + cVar33 & 0xfU);
      auVar55[1] = ((bVar24 >> 4) + bVar24 & 0xf) + ((bVar56 >> 4) + bVar56 & 0xf);
      auVar55[2] = ((char)(ushort)((uint)uVar9 >> 0x14) + cVar25 & 0xfU) +
                   ((char)(ushort)((uint)uVar35 >> 0x14) + cVar57 & 0xfU);
      auVar55[3] = ((bVar26 >> 4) + bVar26 & 0xf) + ((bVar58 >> 4) + bVar58 & 0xf);
      auVar55[4] = ((char)(ushort)((uint6)uVar10 >> 0x24) + cVar27 & 0xfU) +
                   ((char)(ushort)((uint6)uVar36 >> 0x24) + cVar59 & 0xfU);
      auVar55[5] = ((bVar28 >> 4) + bVar28 & 0xf) + ((bVar60 >> 4) + bVar60 & 0xf);
      auVar55[6] = ((char)(ushort)((ulong)uVar11 >> 0x34) + cVar29 & 0xfU) +
                   ((char)(ushort)((ulong)uVar37 >> 0x34) + cVar61 & 0xfU);
      auVar55[7] = ((bVar30 >> 4) + bVar30 & 0xf) + ((bVar62 >> 4) + bVar62 & 0xf);
      auVar55[8] = ((char)(ushort)((unkuint10)auVar15._0_10_ >> 0x44) + cVar31 & 0xfU) +
                   ((char)(ushort)((unkuint10)auVar41._0_10_ >> 0x44) + cVar63 & 0xfU);
      auVar55[9] = ((bVar32 >> 4) + bVar32 & 0xf) + ((bVar64 >> 4) + bVar64 & 0xf);
      auVar55[10] = ((char)(auVar15._10_2_ >> 4) + auVar15[10] & 0xfU) +
                    ((char)(auVar41._10_2_ >> 4) + auVar41[10] & 0xfU);
      auVar55[0xb] = ((auVar15[0xb] >> 4) + auVar15[0xb] & 0xf) +
                     ((auVar41[0xb] >> 4) + auVar41[0xb] & 0xf);
      auVar55[0xc] = ((char)(auVar19._12_2_ >> 4) + auVar19[0xc] & 0xfU) +
                     ((char)(auVar45._12_2_ >> 4) + auVar45[0xc] & 0xfU);
      auVar55[0xd] = ((auVar19[0xd] >> 4) + auVar19[0xd] & 0xf) +
                     ((auVar45[0xd] >> 4) + auVar45[0xd] & 0xf);
      auVar55[0xe] = ((char)(auVar23._14_2_ >> 4) + auVar23[0xe] & 0xfU) +
                     ((char)(auVar53._14_2_ >> 4) + auVar53[0xe] & 0xfU);
      auVar55[0xf] = ((auVar23[0xf] >> 4) + auVar23[0xf] & 0xf) +
                     ((auVar53[0xf] >> 4) + auVar53[0xf] & 0xf);
      auVar78 = psadbw(auVar55,(undefined1  [16])0x0);
      sVar3 = sVar3 + auVar78._8_8_ + auVar78._0_8_;
      uVar5 = uVar6 + 4;
      uVar4 = uVar6 + 7;
      uVar6 = uVar5;
    } while (uVar4 < uVar1);
  }
  if (uVar5 < uVar1) {
    do {
      uVar6 = bitset->array[uVar5] - (bitset->array[uVar5] >> 1 & 0x5555555555555555);
      uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
      sVar3 = sVar3 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return sVar3;
}

Assistant:

size_t bitset_count(const bitset_t *bitset) {
    size_t card = 0;
    size_t k = 0;
    for(; k + 7 < bitset->arraysize; k+=8) {
        card += cbitset_hamming(bitset->array[k]);
        card += cbitset_hamming(bitset->array[k+1]);
        card += cbitset_hamming(bitset->array[k+2]);
        card += cbitset_hamming(bitset->array[k+3]);
        card += cbitset_hamming(bitset->array[k+4]);
        card += cbitset_hamming(bitset->array[k+5]);
        card += cbitset_hamming(bitset->array[k+6]);
        card += cbitset_hamming(bitset->array[k+7]);
    }
    for(; k + 3 < bitset->arraysize; k+=4) {
        card += cbitset_hamming(bitset->array[k]);
        card += cbitset_hamming(bitset->array[k+1]);
        card += cbitset_hamming(bitset->array[k+2]);
        card += cbitset_hamming(bitset->array[k+3]);
    }
    for(; k < bitset->arraysize; k++) {
        card += cbitset_hamming(bitset->array[k]);
    }
    return card;
}